

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::UpdateAxisColors(int axis_flag,ImPlotAxis *axis)

{
  ImU32 IVar1;
  ImVec4 col_grid;
  ImVec4 col_label;
  ImVec4 local_58;
  ImVec4 local_40;
  ImVec4 local_30;
  
  local_30 = GetStyleColorVec4(axis_flag);
  local_58 = GetStyleColorVec4(axis_flag + 1);
  IVar1 = ImGui::GetColorU32(&local_58);
  axis->ColorMaj = IVar1;
  local_40.w = local_58.w * (GImPlot->Style).MinorAlpha;
  local_40.x = local_58.x;
  local_40.y = local_58.y;
  local_40.z = local_58.z;
  IVar1 = ImGui::GetColorU32(&local_40);
  axis->ColorMin = IVar1;
  IVar1 = ImGui::GetColorU32(&local_30);
  axis->ColorTxt = IVar1;
  return;
}

Assistant:

void UpdateAxisColors(int axis_flag, ImPlotAxis* axis) {
    const ImVec4 col_label = GetStyleColorVec4(axis_flag);
    const ImVec4 col_grid  = GetStyleColorVec4(axis_flag + 1);
    axis->ColorMaj  = ImGui::GetColorU32(col_grid);
    axis->ColorMin  = ImGui::GetColorU32(col_grid*ImVec4(1,1,1,GImPlot->Style.MinorAlpha));
    axis->ColorTxt = ImGui::GetColorU32(col_label);
}